

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

int verify_raw_cert(ptls_verify_certificate_t *_self,ptls_t *tls,
                   _func_int_void_ptr_uint16_t_ptls_iovec_t_ptls_iovec_t **verifier,
                   void **verify_data,ptls_iovec_t *certs,size_t num_certs)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ptls_iovec_t expected_pubkey;
  uchar *local_38;
  ulong uStack_30;
  
  local_38 = (uchar *)0x0;
  uStack_30 = 0;
  iVar3 = 0x2a;
  if (num_certs == 1) {
    uVar1 = i2d_PUBKEY((EVP_PKEY *)_self[1].cb,&local_38);
    if (0 < (int)uVar1) {
      uStack_30 = (ulong)uVar1;
      if (certs->len == uStack_30) {
        iVar2 = (*ptls_mem_equal)(local_38,certs->base,certs->len);
        if (iVar2 != 0) {
          EVP_PKEY_up_ref(_self[1].cb);
          *verify_data = _self[1].cb;
          *verifier = verify_sign;
          iVar3 = 0;
        }
      }
    }
  }
  else if (num_certs == 0) {
    __assert_fail("num_certs != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/openssl.c"
                  ,0x566,
                  "int verify_raw_cert(ptls_verify_certificate_t *, ptls_t *, int (**)(void *, uint16_t, ptls_iovec_t, ptls_iovec_t), void **, ptls_iovec_t *, size_t)"
                 );
  }
  free(local_38);
  return iVar3;
}

Assistant:

static int verify_raw_cert(ptls_verify_certificate_t *_self, ptls_t *tls,
                           int (**verifier)(void *, uint16_t algo, ptls_iovec_t, ptls_iovec_t), void **verify_data,
                           ptls_iovec_t *certs, size_t num_certs)
{
    ptls_openssl_raw_pubkey_verify_certificate_t *self = (ptls_openssl_raw_pubkey_verify_certificate_t *)_self;
    int ret = PTLS_ALERT_BAD_CERTIFICATE;
    ptls_iovec_t expected_pubkey = {0};

    assert(num_certs != 0);

    if (num_certs != 1)
        goto Exit;

    int r = i2d_PUBKEY(self->expected_pubkey, &expected_pubkey.base);
    if (r <= 0) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }

    expected_pubkey.len = r;
    if (certs[0].len != expected_pubkey.len)
        goto Exit;

    if (!ptls_mem_equal(expected_pubkey.base, certs[0].base, certs[0].len))
        goto Exit;

    EVP_PKEY_up_ref(self->expected_pubkey);
    *verify_data = self->expected_pubkey;
    *verifier = verify_sign;
    ret = 0;
Exit:
    free(expected_pubkey.base);
    return ret;
}